

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeDamped.cpp
# Opt level: O0

void __thiscall OpenMD::FluctuatingChargeDamped::initialize(FluctuatingChargeDamped *this)

{
  bool bVar1;
  long in_RDI;
  RealType RVar2;
  FluctuatingChargePropagator *in_stack_00000180;
  
  FluctuatingChargePropagator::initialize(in_stack_00000180);
  if ((*(byte *)(in_RDI + 0x28) & 1) != 0) {
    SimInfo::getSimParams(*(SimInfo **)(in_RDI + 0x18));
    bVar1 = Globals::haveDt((Globals *)0x3bd84d);
    if (bVar1) {
      SimInfo::getSimParams(*(SimInfo **)(in_RDI + 0x18));
      RVar2 = Globals::getDt((Globals *)0x3bd869);
      *(RealType *)(in_RDI + 0x48) = RVar2;
      *(double *)(in_RDI + 0x40) = *(double *)(in_RDI + 0x48) * 0.5;
    }
    else {
      snprintf(painCave.errMsg,2000,"FluctuatingChargeDamped Error: dt is not set\n");
      painCave.isFatal = 1;
      simError();
    }
    bVar1 = FluctuatingChargeParameters::haveDragCoefficient
                      ((FluctuatingChargeParameters *)0x3bd8c5);
    if (bVar1) {
      RVar2 = FluctuatingChargeParameters::getDragCoefficient
                        ((FluctuatingChargeParameters *)0x3bd91a);
      *(RealType *)(in_RDI + 0x38) = RVar2;
    }
    else {
      snprintf(painCave.errMsg,2000,
               "If you use the FluctuatingChargeDamped\n\tpropagator, you must set flucQ dragCoefficient .\n"
              );
      painCave.severity = 1;
      painCave.isFatal = 1;
      simError();
    }
  }
  return;
}

Assistant:

void FluctuatingChargeDamped::initialize() {
    FluctuatingChargePropagator::initialize();
    if (hasFlucQ_) {
      if (info_->getSimParams()->haveDt()) {
        dt_  = info_->getSimParams()->getDt();
        dt2_ = dt_ * 0.5;
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "FluctuatingChargeDamped Error: dt is not set\n");
        painCave.isFatal = 1;
        simError();
      }

      if (!fqParams_->haveDragCoefficient()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "If you use the FluctuatingChargeDamped\n"
                 "\tpropagator, you must set flucQ dragCoefficient .\n");

        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
      } else {
        drag_ = fqParams_->getDragCoefficient();
      }
    }
  }